

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deProcess.c
# Opt level: O0

deBool deProcess_sendSignal(deProcess *process,int sigNum)

{
  int iVar1;
  int sigNum_local;
  deProcess *process_local;
  
  if (process->state == PROCESSSTATE_RUNNING) {
    iVar1 = kill(process->pid,sigNum);
    if (iVar1 == 0) {
      process_local._4_4_ = 1;
    }
    else {
      deProcess_setErrorFromErrno(process,"kill() failed");
      process_local._4_4_ = 0;
    }
  }
  else {
    deProcess_setError(process,"Process is not running");
    process_local._4_4_ = 0;
  }
  return process_local._4_4_;
}

Assistant:

static deBool deProcess_sendSignal (deProcess* process, int sigNum)
{
	if (process->state != PROCESSSTATE_RUNNING)
	{
		deProcess_setError(process, "Process is not running");
		return DE_FALSE;
	}

	if (kill(process->pid, sigNum) == 0)
		return DE_TRUE;
	else
	{
		deProcess_setErrorFromErrno(process, "kill() failed");
		return DE_FALSE;
	}
}